

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  double dVar3;
  float max_1;
  float min_1;
  float slope_1;
  float w_2;
  float val_1;
  int k_1;
  float *sptr_1;
  Mat m_1;
  int q;
  float *kptr_1;
  float sum_1;
  int j_2;
  int i_2;
  float *weight_data_ptr;
  Mat *in_stack_00000160;
  ConvolutionDepthWise *in_stack_00000168;
  float *outptr_1;
  int p;
  int g_1;
  int num_output_g;
  int channels_g;
  float max;
  float min;
  float slope;
  float w_1;
  float val;
  int k;
  float *sptr;
  float sum;
  int j_1;
  int i_1;
  Mat m;
  float *kptr;
  float *outptr;
  int g;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffca0;
  Mat *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  float in_stack_fffffffffffffcb4;
  size_type in_stack_fffffffffffffcb8;
  Mat *in_stack_fffffffffffffcc0;
  float local_2fc;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  float fVar4;
  undefined4 in_stack_fffffffffffffd74;
  float in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int iVar5;
  Mat local_270;
  int local_22c;
  float *local_228;
  float local_21c;
  int local_218;
  int local_214;
  float *local_210;
  Mat local_208;
  float *local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  int local_194;
  float *local_190;
  float local_184;
  int local_180;
  int local_17c;
  Mat local_178;
  float *local_138;
  Mat local_130;
  float *local_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  reference local_d0;
  vector<int,_std::allocator<int>_> local_c0;
  int local_a4;
  int local_a0;
  int local_9c;
  undefined4 local_98;
  Mat local_88;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  if (((*(byte *)(in_RCX + 0x1a) & 1) == 0) || (*(long *)(in_RDI + 0x150) != 1)) {
    local_2c = *(int *)(in_RSI + 0x2c);
    local_30 = *(int *)(in_RSI + 0x30);
    local_34 = *(int *)(in_RSI + 0x34);
    local_40 = *(undefined8 *)(in_RSI + 0x10);
    if ((local_34 % *(int *)(in_RDI + 0xf0) == 0) &&
       (*(int *)(in_RDI + 0xb8) % *(int *)(in_RDI + 0xf0) == 0)) {
      local_44 = *(int *)(in_RDI + 0xc4) * (*(int *)(in_RDI + 0xbc) + -1) + 1;
      local_48 = *(int *)(in_RDI + 200) * (*(int *)(in_RDI + 0xc0) + -1) + 1;
      Mat::Mat(&local_88);
      make_padding((ConvolutionDepthWise *)
                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (Mat *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   (Mat *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (Option *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      bVar1 = Mat::empty(in_stack_fffffffffffffca0);
      if (bVar1) {
        local_4 = -100;
        local_98 = 1;
      }
      else {
        local_2c = local_88.w;
        local_30 = local_88.h;
        local_9c = (local_88.w - local_44) / *(int *)(in_RDI + 0xcc) + 1;
        local_a0 = (local_88.h - local_48) / *(int *)(in_RDI + 0xd0) + 1;
        local_a4 = *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc0);
        std::allocator<int>::allocator((allocator<int> *)0x1a1c69);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0,
                   in_stack_fffffffffffffcb8,
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        std::allocator<int>::~allocator((allocator<int> *)0x1a1c95);
        local_d0 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,0);
        local_d4 = 0;
        local_d8 = 0;
        local_dc = local_2c * *(int *)(in_RDI + 200) -
                   *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc4);
        for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0xc0); local_e0 = local_e0 + 1) {
          for (local_e4 = 0; local_e4 < *(int *)(in_RDI + 0xbc); local_e4 = local_e4 + 1) {
            local_d0[local_d4] = local_d8;
            local_d4 = local_d4 + 1;
            local_d8 = *(int *)(in_RDI + 0xc4) + local_d8;
          }
          local_d8 = local_dc + local_d8;
        }
        Mat::create(in_stack_fffffffffffffcc0,(int)(in_stack_fffffffffffffcb8 >> 0x20),
                    (int)in_stack_fffffffffffffcb8,(int)in_stack_fffffffffffffcb4,
                    (size_t)in_stack_fffffffffffffca8,(Allocator *)in_stack_fffffffffffffca0);
        bVar1 = Mat::empty(in_stack_fffffffffffffca0);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          if ((local_34 == *(int *)(in_RDI + 0xf0)) &&
             (*(int *)(in_RDI + 0xf0) == *(int *)(in_RDI + 0xb8))) {
            for (local_e8 = 0; local_e8 < *(int *)(in_RDI + 0xf0); local_e8 = local_e8 + 1) {
              Mat::channel(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20)
                          );
              pfVar2 = Mat::operator_cast_to_float_(&local_130);
              Mat::~Mat((Mat *)0x1a1f1a);
              local_f0 = pfVar2;
              local_138 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x140));
              local_138 = local_138 + local_a4 * local_e8;
              Mat::channel(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20)
                          );
              for (local_17c = 0; local_17c < local_a0; local_17c = local_17c + 1) {
                for (local_180 = 0; local_180 < local_9c; local_180 = local_180 + 1) {
                  local_184 = 0.0;
                  if (*(int *)(in_RDI + 0xe8) != 0) {
                    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x180),(long)local_e8);
                    local_184 = *pfVar2;
                  }
                  local_190 = Mat::row(&local_178,local_17c * *(int *)(in_RDI + 0xd0));
                  local_190 = local_190 + local_180 * *(int *)(in_RDI + 0xcc);
                  for (local_194 = 0; local_194 < local_a4; local_194 = local_194 + 1) {
                    local_198 = local_190[local_d0[local_194]];
                    local_19c = local_138[local_194];
                    local_184 = local_198 * local_19c + local_184;
                  }
                  if (*(int *)(in_RDI + 0xf8) == 1) {
                    local_1a0 = 0.0;
                    pfVar2 = std::max<float>(&local_184,&local_1a0);
                    local_184 = *pfVar2;
                  }
                  else if (*(int *)(in_RDI + 0xf8) == 2) {
                    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x100),0);
                    local_1a4 = *pfVar2;
                    if (local_184 <= 0.0) {
                      local_2fc = local_184 * local_1a4;
                    }
                    else {
                      local_2fc = local_184;
                    }
                    local_184 = local_2fc;
                  }
                  else if (*(int *)(in_RDI + 0xf8) == 3) {
                    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x100),0);
                    local_1a8 = *pfVar2;
                    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x100),1);
                    local_1ac = *pfVar2;
                    if (local_184 < local_1a8) {
                      local_184 = local_1a8;
                    }
                    if (local_1ac < local_184) {
                      local_184 = local_1ac;
                    }
                  }
                  else if (*(int *)(in_RDI + 0xf8) == 4) {
                    dVar3 = std::exp((double)((ulong)(uint)local_184 ^ 0x8000000080000000));
                    local_184 = 1.0 / (SUB84(dVar3,0) + 1.0);
                  }
                  local_f0[local_180] = local_184;
                }
                local_f0 = local_f0 + local_9c;
              }
              Mat::~Mat((Mat *)0x1a23f4);
            }
          }
          else {
            local_1b0 = local_34 / *(int *)(in_RDI + 0xf0);
            local_1b4 = *(int *)(in_RDI + 0xb8) / *(int *)(in_RDI + 0xf0);
            for (local_1b8 = 0; local_1b8 < *(int *)(in_RDI + 0xf0); local_1b8 = local_1b8 + 1) {
              for (local_1bc = 0; local_1bc < local_1b4; local_1bc = local_1bc + 1) {
                Mat::channel(in_stack_fffffffffffffca8,
                             (int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
                pfVar2 = Mat::operator_cast_to_float_(&local_208);
                Mat::~Mat((Mat *)0x1a24d7);
                local_1c8 = pfVar2;
                local_210 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x140));
                local_210 = local_210 + local_a4 * local_1b0 * local_1b4 * local_1b8;
                for (local_214 = 0; local_214 < local_a0; local_214 = local_214 + 1) {
                  for (local_218 = 0; local_218 < local_9c; local_218 = local_218 + 1) {
                    local_21c = 0.0;
                    if (*(int *)(in_RDI + 0xe8) != 0) {
                      pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x180),
                                               (long)(local_1b4 * local_1b8 + local_1bc));
                      local_21c = *pfVar2;
                    }
                    local_228 = local_210 + local_a4 * local_1b0 * local_1bc;
                    for (local_22c = 0; local_22c < local_1b0; local_22c = local_22c + 1) {
                      Mat::channel(in_stack_fffffffffffffca8,
                                   (int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
                      pfVar2 = Mat::row(&local_270,local_214 * *(int *)(in_RDI + 0xd0));
                      for (iVar5 = 0; iVar5 < local_a4; iVar5 = iVar5 + 1) {
                        local_21c = pfVar2[(long)(local_218 * *(int *)(in_RDI + 0xcc)) +
                                           (long)local_d0[iVar5]] * local_228[iVar5] + local_21c;
                      }
                      local_228 = local_228 + local_a4;
                      Mat::~Mat((Mat *)0x1a27d1);
                    }
                    if (*(int *)(in_RDI + 0xf8) == 1) {
                      pfVar2 = std::max<float>(&local_21c,(float *)&stack0xfffffffffffffd78);
                      local_21c = *pfVar2;
                    }
                    else if (*(int *)(in_RDI + 0xf8) == 2) {
                      pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x100),0);
                      in_stack_fffffffffffffcb4 = local_21c;
                      if (local_21c <= 0.0) {
                        local_21c = local_21c * *pfVar2;
                        in_stack_fffffffffffffcb4 = local_21c;
                      }
                    }
                    else if (*(int *)(in_RDI + 0xf8) == 3) {
                      in_stack_fffffffffffffca8 = (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x100),0);
                      fVar4 = *(float *)&in_stack_fffffffffffffca8->data;
                      in_stack_fffffffffffffca0 = (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x100),1);
                      if (local_21c < fVar4) {
                        local_21c = fVar4;
                      }
                      if (*(float *)&in_stack_fffffffffffffca0->data < local_21c) {
                        local_21c = *(float *)&in_stack_fffffffffffffca0->data;
                      }
                    }
                    else if (*(int *)(in_RDI + 0xf8) == 4) {
                      dVar3 = std::exp((double)((ulong)(uint)local_21c ^ 0x8000000080000000));
                      local_21c = 1.0 / (SUB84(dVar3,0) + 1.0);
                    }
                    local_1c8[local_218] = local_21c;
                  }
                  local_1c8 = local_1c8 + local_9c;
                }
              }
            }
          }
          local_4 = 0;
        }
        local_98 = 1;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      }
      Mat::~Mat((Mat *)0x1a2acb);
    }
    else {
      local_4 = -100;
    }
  }
  else {
    local_4 = forward_int8(in_stack_00000168,in_stack_00000160,(Mat *)weight_data_ptr,_j_2);
  }
  return local_4;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    if (activation_type == 1)
                    {
                        sum = std::max(sum, 0.f);
                    }
                    else if (activation_type == 2)
                    {
                        float slope = activation_params[0];
                        sum = sum > 0.f ? sum : sum * slope;
                    }
                    else if (activation_type == 3)
                    {
                        float min = activation_params[0];
                        float max = activation_params[1];
                        if (sum < min)
                            sum = min;
                        if (sum > max)
                            sum = max;
                    }
                    else if (activation_type == 4)
                    {
                        sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g=0; g<group; g++)
        {
            for (int p=0; p<num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[num_output_g * g + p];

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q=0; q<channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const float* sptr = m.row(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                float val = sptr[ space_ofs[k] ];
                                float w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        if (activation_type == 1)
                        {
                            sum = std::max(sum, 0.f);
                        }
                        else if (activation_type == 2)
                        {
                            float slope = activation_params[0];
                            sum = sum > 0.f ? sum : sum * slope;
                        }
                        else if (activation_type == 3)
                        {
                            float min = activation_params[0];
                            float max = activation_params[1];
                            if (sum < min)
                                sum = min;
                            if (sum > max)
                                sum = max;
                        }
                        else if (activation_type == 4)
                        {
                            sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}